

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void structDeclaration(void)

{
  object *poVar1;
  typeDesc *ptVar2;
  typeDesc *ref;
  typeDesc *type;
  typeDesc *tmpType;
  object *obj;
  object *tmpObj;
  
  ref = (typeDesc *)0x0;
  if (currentSymbol != 0x268) {
    mark("missing struct keyword");
    exit(-1);
  }
  getSymbol();
  if (currentSymbol != 0x1f5) {
    mark("missing struct identifier");
    exit(-1);
  }
  poVar1 = newObj(0x2bf);
  getSymbol();
  if (currentSymbol == 0x131) {
    getSymbol();
    if (currentSymbol == 0x132) {
      mark("declaration of empty struct not allowed");
      exit(-1);
    }
    ref = newType();
    ref->form = 0x323;
    ref->size = 0;
    poVar1->typeIndex = ref->index;
    ptVar2 = newType();
    ptVar2->form = 0x324;
    ptVar2->size = 4;
    ptVar2->base = ref;
    ref->refIndex = ptVar2->index;
    openScope();
    while (currentSymbol == 0x267) {
      getSymbol();
      poVar1 = variableDeclaration(0x2be);
      poVar1->val = ref->size;
      ptVar2 = getType(poVar1->typeIndex);
      ref->size = ref->size + ptVar2->size;
    }
    if (currentSymbol != 0x132) {
      mark("bad variable declaration");
      exit(-1);
    }
  }
  if (currentSymbol != 0x132) {
    mark("missing right curly bracket in struct declaration");
    exit(-1);
  }
  getSymbol();
  semicolon();
  ref->fields = topScope->next;
  closeScope();
  return;
}

Assistant:

procedure 
void structDeclaration(void) {
	variable struct object *tmpObj; variable struct object *obj;
	variable struct typeDesc *tmpType; variable struct typeDesc *type; variable struct typeDesc *ref;
	ref = NULL; obj = NULL; type = NULL; tmpObj = NULL; tmpType = NULL;
	if (currentSymbol == SYMBOL_STRUCT) {
		getSymbol();		
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			obj = newObj(CLASS_TYP);
			getSymbol();
			if (currentSymbol == SYMBOL_CLBRAK) {
				getSymbol();
				if (currentSymbol == SYMBOL_CRBRAK) {
					mark("declaration of empty struct not allowed");
					exit(-1);
				}
				type = newType(); 	/* rec. type */
				type->form = FORM_RECORD; type->size = 0;	
				obj->typeIndex = type->index;
				ref = newType(); 	/* ref. to rec. */
				ref->form = FORM_REF; 
				ref->size = wordSize; 
				ref->base = type; 
				type->refIndex = ref->index;
				openScope();
				while (currentSymbol == SYMBOL_VAR) {
					getSymbol();
					tmpObj = variableDeclaration(CLASS_FLD);
					tmpObj->val = type->size;
					tmpType = getType(tmpObj->typeIndex);
					type->size = type->size + tmpType->size;
				}
				if (currentSymbol != SYMBOL_CRBRAK) {
					mark("bad variable declaration");
					exit(-1);
				}
			}
			if (currentSymbol == SYMBOL_CRBRAK){
				getSymbol();
			} else {
				mark("missing right curly bracket in struct declaration");
				exit(-1);
			}
			semicolon();
		} else {
			mark("missing struct identifier");
			exit(-1);
		}
		type->fields = topScope->next;
		closeScope();
	} else {
		mark("missing struct keyword");
		exit(-1);
	}
}